

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_armor_upgrades.hpp
# Opt level: O1

uint32_t PatchArmorUpgrades::inject_function_change_item_in_reward_textbox
                   (ROM *rom,uint32_t function_alter_item_in_d0)

{
  uint32_t uVar1;
  Code func;
  string local_b8;
  Code local_98;
  Param local_20;
  undefined8 local_18;
  
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_b8._M_string_length._4_4_ = 2;
  local_b8._M_string_length._0_4_ = function_alter_item_in_d0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::jsr(&local_98,(Param *)&local_b8);
  local_b8._M_string_length._0_4_ = (uint32_t)local_b8._M_string_length & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00261bb0;
  local_20._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_18 = 0x200ff1196;
  md::Code::move(&local_98,(Param *)&local_b8,&local_20,WORD);
  md::Code::rts(&local_98);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  uVar1 = md::ROM::inject_code(rom,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

[[nodiscard]] static uint32_t inject_function_change_item_in_reward_textbox(md::ROM& rom, uint32_t function_alter_item_in_d0)
    {
        md::Code func;
        {
            func.jsr(function_alter_item_in_d0);
            func.movew(reg_D0, addr_(0xFF1196));
            func.rts();
        }
        return rom.inject_code(func);
    }